

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::emit_wave_match_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  TypeID TVar4;
  Id IVar5;
  Builder *pBVar6;
  Value *pVVar7;
  Type *pTVar8;
  Operation *pOVar9;
  Operation *pOVar10;
  Operation *pOVar11;
  int width;
  Capability local_38 [2];
  
  pBVar6 = Converter::Impl::builder(impl);
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar8 = LLVMBC::Value::getType(pVVar7);
  IVar2 = Converter::Impl::get_type_id(impl,pTVar8,0);
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar8 = LLVMBC::Value::getType(pVVar7);
  TVar4 = LLVMBC::Type::getTypeID(pTVar8);
  if (TVar4 == DoubleTyID) {
    width = 0x40;
  }
  else if (TVar4 == FloatTyID) {
    width = 0x20;
  }
  else {
    if (TVar4 != HalfTyID) goto LAB_0016b71e;
    bVar1 = Converter::Impl::support_native_fp16_operations(impl);
    width = (uint)!bVar1 * 0x10 + 0x10;
  }
  IVar2 = spv::Builder::makeIntegerType(pBVar6,width,false);
  pOVar9 = Converter::Impl::allocate(impl,OpBitcast,IVar2);
  Operation::add_id(pOVar9,IVar3);
  IVar3 = pOVar9->id;
  Converter::Impl::add(impl,pOVar9,false);
LAB_0016b71e:
  if ((impl->options).nv_subgroup_partition_enabled == true) {
    spv::Builder::addExtension(pBVar6,"SPV_NV_shader_subgroup_partitioned");
    local_38[0] = CapabilityGroupNonUniformPartitionedNV;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar6->capabilities,local_38);
    IVar2 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
    IVar2 = spv::Builder::makeVectorType(pBVar6,IVar2,4);
    pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformPartitionNV,(Value *)instruction,IVar2)
    ;
    Operation::add_id(pOVar9,IVar3);
    Converter::Impl::add(impl,pOVar9,false);
    if (((impl->execution_model == ExecutionModelFragment) &&
        ((impl->options).strict_helper_lane_waveops == true)) &&
       (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
      IVar3 = spv::Builder::makeBoolType(pBVar6);
      pOVar10 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar3);
      Converter::Impl::add(impl,pOVar10,false);
      IVar3 = spv::Builder::makeBoolType(pBVar6);
      pOVar11 = Converter::Impl::allocate(impl,OpLogicalNot,IVar3);
      Operation::add_id(pOVar11,pOVar10->id);
      Converter::Impl::add(impl,pOVar11,false);
      IVar3 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
      IVar3 = spv::Builder::makeVectorType(pBVar6,IVar3,4);
      pOVar10 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar3);
      IVar3 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(pBVar6,IVar3,3,false);
      Operation::add_id(pOVar10,IVar3);
      Operation::add_id(pOVar10,pOVar11->id);
      Converter::Impl::add(impl,pOVar10,false);
      local_38[1] = 0x40;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar6->capabilities,local_38 + 1);
      IVar3 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
      IVar3 = spv::Builder::makeVectorType(pBVar6,IVar3,4);
      pOVar11 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar3);
      Operation::add_id(pOVar11,pOVar9->id);
      Operation::add_id(pOVar11,pOVar10->id);
      Converter::Impl::add(impl,pOVar11,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar11->id);
    }
  }
  else {
    IVar2 = SPIRVModule::get_helper_call_id(impl->spirv_module,WaveMatch,IVar2);
    IVar5 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
    IVar5 = spv::Builder::makeVectorType(pBVar6,IVar5,4);
    pOVar9 = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction,IVar5);
    Operation::add_id(pOVar9,IVar2);
    Operation::add_id(pOVar9,IVar3);
    if (((impl->execution_model == ExecutionModelFragment) &&
        ((impl->options).strict_helper_lane_waveops == true)) &&
       (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
      pBVar6 = Converter::Impl::builder(impl);
      IVar3 = spv::Builder::makeBoolType(pBVar6);
      pOVar10 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar3);
      Converter::Impl::add(impl,pOVar10,false);
      Operation::add_id(pOVar9,pOVar10->id);
    }
    Converter::Impl::add(impl,pOVar9,false);
  }
  return true;
}

Assistant:

bool emit_wave_match_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id type_id = impl.get_type_id(instruction->getOperand(1)->getType());
	spv::Id value_id = impl.get_id_for_value(instruction->getOperand(1));

	// It's not safe to use FOrdEqual since a loop with NaN will never compare equal to BroadcastFirst().
	// Make sure we compare equal with uint.
	spv::Op cast_op = spv::OpNop;
	switch (instruction->getOperand(1)->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		type_id = builder.makeUintType(impl.support_native_fp16_operations() ? 16 : 32);
		cast_op = spv::OpBitcast;
		break;

	case llvm::Type::TypeID::FloatTyID:
		type_id = builder.makeUintType(32);
		cast_op = spv::OpBitcast;
		break;

	case llvm::Type::TypeID::DoubleTyID:
		type_id = builder.makeUintType(64);
		cast_op = spv::OpBitcast;
		break;

	default:
		break;
	}

	if (cast_op != spv::OpNop)
	{
		auto *bitcast_op = impl.allocate(cast_op, type_id);
		bitcast_op->add_id(value_id);
		value_id = bitcast_op->id;
		impl.add(bitcast_op);
	}

	if (impl.options.nv_subgroup_partition_enabled)
	{
		builder.addExtension("SPV_NV_shader_subgroup_partitioned");
		builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
		auto *op = impl.allocate(spv::OpGroupNonUniformPartitionNV, instruction,
		                         builder.makeVectorType(builder.makeUintType(32), 4));
		op->add_id(value_id);
		impl.add(op);

		if (wave_op_needs_helper_lane_masking(impl))
		{
			auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, builder.makeBoolType());
			impl.add(is_helper_lane);

			auto *not_op = impl.allocate(spv::OpLogicalNot, builder.makeBoolType());
			not_op->add_id(is_helper_lane->id);
			impl.add(not_op);

			auto *non_helper_op = impl.allocate(spv::OpGroupNonUniformBallot,
			                                    builder.makeVectorType(builder.makeUintType(32), 4));
			non_helper_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
			non_helper_op->add_id(not_op->id);
			impl.add(non_helper_op);
			builder.addCapability(spv::CapabilityGroupNonUniformBallot);

			auto *and_op = impl.allocate(spv::OpBitwiseAnd, builder.makeVectorType(builder.makeUintType(32), 4));
			and_op->add_id(op->id);
			and_op->add_id(non_helper_op->id);
			impl.add(and_op);

			impl.rewrite_value(instruction, and_op->id);
		}
	}
	else
	{
		spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::WaveMatch, type_id);
		auto *call_op =
		    impl.allocate(spv::OpFunctionCall, instruction, builder.makeVectorType(builder.makeUintType(32), 4));
		call_op->add_id(call_id);
		call_op->add_id(value_id);

		if (wave_op_needs_helper_lane_masking(impl))
		{
			auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
			impl.add(is_helper_lane);
			call_op->add_id(is_helper_lane->id);
		}

		impl.add(call_op);
	}

	return true;
}